

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  int iVar5;
  char local_228 [528];
  
  sqlite3_snprintf(0x200,local_228,"%s",zFilename);
  uVar2 = strlen(local_228);
  if (0 < (int)uVar2) {
    do {
      if (local_228[uVar2 & 0xffffffff] == '/') {
        pcVar3 = local_228 + (uVar2 & 0xffffffff);
        goto LAB_00146870;
      }
      iVar1 = (int)uVar2;
      uVar2 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
  }
  if (local_228[0] != '/') {
    local_228[0] = '.';
  }
  pcVar3 = local_228 + 1;
LAB_00146870:
  *pcVar3 = '\0';
  iVar5 = 0;
  iVar1 = robust_open(local_228,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    iVar5 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x9db1,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    puVar4 = (uint *)__errno_location();
    sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x9db1,(ulong)*puVar4,"openDirectory",local_228
                ,"");
  }
  return iVar5;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}